

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-and-bound-solver.hpp
# Opt level: O1

int __thiscall
baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,float>::
solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data[]>>>
          (branch_and_bound_solver<baryonyx::itm::maximize_tag,float> *this,
          unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[]>_>
          *reduced_cost,int r_size,int bk_min,int bk_max)

{
  int iVar1;
  rc_data *prVar2;
  item *piVar3;
  int iVar4;
  size_type sVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  __normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::item_*,_std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::item>_>_>
  _Var9;
  solver_failure *this_00;
  uint uVar10;
  float *pfVar11;
  long lVar12;
  int iVar13;
  int *piVar14;
  long lVar15;
  uint uVar16;
  long lVar17;
  bool bVar18;
  
  if (r_size < 4) {
LAB_004d82b2:
    solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data[]>>>
              ();
LAB_004d82b7:
    solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data[]>>>
              ();
  }
  else {
    if (bk_max < bk_min) goto LAB_004d82b7;
    *(int *)(this + 0x5c) = bk_min;
    *(int *)(this + 0x60) = bk_max;
    std::
    vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::item>_>
    ::resize((vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::item>_>
              *)(this + 0x20),(ulong)(uint)r_size);
    iVar4 = shared_subvector::init((shared_subvector *)this,(EVP_PKEY_CTX *)(ulong)(uint)r_size);
    if ((char)iVar4 == '\0') goto LAB_004d82c1;
    sVar5 = shared_subvector::emplace((shared_subvector *)this);
    *(size_type *)(this + 0x58) = sVar5;
    if (sVar5 == 0) {
      if (*(long *)(this + 0x40) != *(long *)(this + 0x38)) {
        *(long *)(this + 0x40) = *(long *)(this + 0x38);
      }
      prVar2 = (reduced_cost->_M_t).
               super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[]>_>
               .
               super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data_*,_false>
               ._M_head_impl;
      lVar7 = *(long *)(this + 0x20);
      lVar12 = 0;
      do {
        *(undefined4 *)(lVar7 + lVar12 * 2) = *(undefined4 *)((long)&prVar2->value + lVar12);
        *(undefined4 *)(lVar7 + 0x10 + lVar12 * 2) = *(undefined4 *)((long)&prVar2->id + lVar12);
        iVar4 = *(int *)((long)&prVar2->f + lVar12);
        *(int *)(lVar7 + 0xc + lVar12 * 2) = iVar4;
        iVar13 = -iVar4;
        if (0 < iVar4) {
          iVar13 = iVar4;
        }
        *(int *)(lVar7 + 8 + lVar12 * 2) = iVar13;
        *(undefined4 *)(lVar7 + 0x14 + lVar12 * 2) = 0;
        lVar12 = lVar12 + 0xc;
      } while ((ulong)(uint)r_size * 0xc != lVar12);
      shared_subvector::check_index((shared_subvector *)this,0);
      if ((ulong)*(uint *)(this + 0x18) != 0) {
        memset(*(void **)this,0,(ulong)*(uint *)(this + 0x18));
      }
      lVar7 = *(long *)(this + 0x20);
      lVar12 = *(long *)(this + 0x28);
      if (lVar7 != lVar12) {
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,float>::item*,std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,float>::item,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,float>::item>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (lVar7,lVar12,(int)LZCOUNT((lVar12 - lVar7 >> 3) * -0x5555555555555555) * 2 ^ 0x7e
                  );
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,float>::item*,std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,float>::item,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,float>::item>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (lVar7,lVar12);
      }
      lVar7 = *(long *)(this + 0x20);
      lVar12 = *(long *)(this + 0x28);
      lVar6 = (lVar12 - lVar7 >> 3) * -0x5555555555555555;
      if (lVar12 != lVar7) {
        iVar4 = *(int *)(this + 0x5c);
        iVar13 = *(int *)(this + 0x60);
        piVar14 = (int *)(lVar7 + 0xc);
        lVar17 = lVar6;
        do {
          if (*piVar14 < 0) {
            iVar1 = piVar14[-1];
            iVar4 = iVar4 + iVar1;
            *(int *)(this + 0x5c) = iVar4;
            iVar13 = iVar13 + iVar1;
            *(int *)(this + 0x60) = iVar13;
          }
          piVar14 = piVar14 + 6;
          lVar17 = lVar17 + -1;
        } while (lVar17 != 0);
      }
      *(undefined4 *)(lVar12 + -0x14) = *(undefined4 *)(lVar12 + -0x18);
      iVar4 = (int)lVar6;
      if (1 < iVar4) {
        uVar8 = (ulong)(iVar4 - 2);
        pfVar11 = (float *)(lVar7 + uVar8 * 0x18);
        lVar7 = uVar8 + 1;
        do {
          pfVar11[1] = pfVar11[7] + *pfVar11;
          pfVar11 = pfVar11 + -6;
          lVar12 = lVar7 + -1;
          bVar18 = 0 < lVar7;
          lVar7 = lVar12;
        } while (lVar12 != 0 && bVar18);
      }
      if (*(int *)(this + 0x60) == *(int *)(this + 0x5c)) {
        branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::solve_equality
                  ((branch_and_bound_solver<baryonyx::itm::maximize_tag,_float> *)this);
      }
      else {
        branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::solve_inequality
                  ((branch_and_bound_solver<baryonyx::itm::maximize_tag,_float> *)this);
      }
      lVar7 = *(long *)(this + 0x20);
      lVar12 = *(long *)(this + 0x28);
      uVar8 = (lVar12 - lVar7 >> 3) * -0x5555555555555555;
      if ((int)uVar8 != 0) {
        uVar10 = *(uint *)(this + 0x58);
        lVar6 = *(long *)this;
        lVar17 = *(long *)(this + 8);
        lVar15 = 0;
        uVar16 = uVar10;
        do {
          if (*(int *)(lVar7 + 0xc + lVar15) < 1) {
            if ((ulong)(lVar17 - lVar6) <= (ulong)uVar16) goto LAB_004d82ad;
            bVar18 = *(char *)(lVar6 + (ulong)uVar16) == '\0';
          }
          else {
            if ((ulong)(lVar17 - lVar6) <= (ulong)uVar10) {
              solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data[]>>>
                        ();
LAB_004d82ad:
              solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data[]>>>
                        ();
              goto LAB_004d82b2;
            }
            bVar18 = *(char *)(lVar6 + (ulong)uVar10) != '\0';
          }
          *(uint *)(lVar7 + 0x14 + lVar15) = (uint)bVar18;
          uVar16 = uVar16 + 1;
          uVar10 = uVar10 + 1;
          lVar15 = lVar15 + 0x18;
        } while ((uVar8 & 0xffffffff) * 0x18 != lVar15);
      }
      if (lVar7 != lVar12) {
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,float>::item*,std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,float>::item,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,float>::item>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,float>::solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data[]>>>(std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data[]>>&,int,int,int)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (lVar7,lVar12,(int)LZCOUNT(uVar8) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,float>::item*,std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,float>::item,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,float>::item>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,float>::solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data[]>>>(std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data[]>>&,int,int,int)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (lVar7,lVar12);
      }
      _Var9 = std::
              __find_if<__gnu_cxx::__normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,float>::item*,std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,float>::item,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,float>::item>>>,__gnu_cxx::__ops::_Iter_pred<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,float>::solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data[]>>>(std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data[]>>&,int,int,int)::_lambda(auto:1_const&)_1_>>
                        (*(undefined8 *)(this + 0x20),*(undefined8 *)(this + 0x28));
      lVar7 = *(long *)(this + 0x20);
      piVar3 = *(item **)(this + 0x28);
      lVar12 = (long)piVar3 - lVar7;
      if (lVar12 != 0) {
        lVar12 = (lVar12 >> 3) * -0x5555555555555555;
        prVar2 = (reduced_cost->_M_t).
                 super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[]>_>
                 .
                 super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data_*,_false>
                 ._M_head_impl;
        lVar6 = 8;
        do {
          *(undefined4 *)((long)prVar2 + lVar6 + -8) = *(undefined4 *)(lVar7 + -0x10 + lVar6 * 2);
          *(undefined4 *)((long)prVar2 + lVar6 + -4) = *(undefined4 *)(lVar7 + lVar6 * 2);
          *(undefined4 *)((long)&prVar2->value + lVar6) = *(undefined4 *)(lVar7 + -4 + lVar6 * 2);
          lVar6 = lVar6 + 0xc;
          lVar12 = lVar12 + -1;
        } while (lVar12 != 0);
      }
      if (_Var9._M_current == piVar3) {
        uVar10 = -(uint)(*(int *)(lVar7 + 0x14) == 0) | r_size;
      }
      else {
        uVar10 = (int)((ulong)((long)_Var9._M_current - lVar7) >> 3) * -0x55555555 - 1;
      }
      return uVar10;
    }
  }
  solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data[]>>>
            ();
LAB_004d82c1:
  this_00 = (solver_failure *)__cxa_allocate_exception(0x18);
  solver_failure::solver_failure(this_00,no_solver_available);
  __cxa_throw(this_00,&solver_failure::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int solve(R& reduced_cost, int r_size, int bk_min, int bk_max)
    {
        bx_assert(r_size >= 4);
        bx_assert(bk_min <= bk_max);

        b_min = bk_min;
        b_max = bk_max;

        items.resize(r_size);
        if (!subvector.init(r_size))
            throw solver_failure(solver_error_tag::no_solver_available);

        solution = subvector.emplace();

        bx_assert(solution == 0u);

        nodes.clear();

        for (int i = 0; i != r_size; ++i) {
            items[i].r = reduced_cost[i].value;
            items[i].variable = reduced_cost[i].id;
            items[i].original_factor = reduced_cost[i].f;
            items[i].factor = std::abs(reduced_cost[i].f);
            items[i].result = 0;
        }

        std::fill_n(
          subvector.element_data(solution), subvector.element_size(), 0);

        std::sort(std::begin(items), std::end(items));

        for (std::size_t i = 0, e = items.size(); i != e; ++i) {
            if (items[i].original_factor < 0) {
                b_min += items[i].factor;
                b_max += items[i].factor;
            }
        }

        // Compute the inversion of the sum z
        items.back().sum_z = items.back().r;
        for (int i = length(items) - 2; i >= 0; --i)
            items[i].sum_z = items[i + 1].sum_z + items[i].r;

        if (b_max == b_min)
            solve_equality();
        else
            solve_inequality();

        for (int i = 0, e = length(items); i != e; ++i) {
            if (items[i].original_factor > 0)
                items[i].result = subvector[solution + i] == 0 ? 0 : 1;
            else
                items[i].result = subvector[solution + i] == 0 ? 1 : 0;
        }

        std::sort(std::begin(items),
                  std::end(items),
                  [](const auto& lhs, const auto& rhs) {
                      if (lhs.result == rhs.result) {
                          if constexpr (std::is_same_v<Mode, minimize_tag>)
                              return lhs.r < rhs.r;
                          else
                              return lhs.r > rhs.r;
                      } else
                          return lhs.result > rhs.result;
                  });

        auto middle =
          std::find_if(std::begin(items),
                       std::end(items),
                       [](const auto& item) { return item.result == 0; });

        for (std::size_t i = 0, e = items.size(); i != e; ++i) {
            reduced_cost[i].value = items[i].r;
            reduced_cost[i].id = items[i].variable;
            reduced_cost[i].f = items[i].original_factor;
        }

        if (middle == std::end(items))
            return items[0].result == 0 ? -1 : r_size;

        return static_cast<int>(std::distance(std::begin(items), middle) - 1);
    }